

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_legacy_uniform(CompilerHLSL *this,SPIRVariable *var)

{
  uint32_t id;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  SPIRType *local_20;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  local_20 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
  if ((*(uint *)&(local_20->super_IVariant).field_0xc | 2) != 0x12) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x24])(local_78,this,type);
    CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,local_78,(char (*) [2])0x4d9ce2);
    ::std::__cxx11::string::~string((string *)local_78);
    return;
  }
  local_55 = 1;
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_40,"Separate image and samplers not supported in legacy HLSL.",&local_41);
  CompilerError::CompilerError(this_00,(string *)local_40);
  local_55 = 0;
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerHLSL::emit_legacy_uniform(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	switch (type.basetype)
	{
	case SPIRType::Sampler:
	case SPIRType::Image:
		SPIRV_CROSS_THROW("Separate image and samplers not supported in legacy HLSL.");

	default:
		statement(variable_decl(var), ";");
		break;
	}
}